

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O1

void __thiscall
glslang::TResolverInOutAdaptor::operator()
          (TResolverInOutAdaptor *this,
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
          *entKey)

{
  TVarEntryInfo *pTVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  undefined4 extraout_var_00;
  undefined8 *puVar4;
  undefined4 extraout_var_01;
  TString errorMsg;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_40;
  
  pTVar1 = &entKey->second;
  (entKey->second).upgradedToPushConstantPacking = ElpNone;
  (entKey->second).newBinding = -1;
  (entKey->second).newSet = -1;
  (entKey->second).newLocation = -1;
  (entKey->second).newComponent = -1;
  (entKey->second).newIndex = -1;
  iVar2 = (*this->resolver->_vptr_TIoMapResolver[6])
                    (this->resolver,(ulong)(entKey->second).stage,pTVar1);
  if ((char)iVar2 != '\0') {
    (*this->resolver->_vptr_TIoMapResolver[7])(this->resolver,(ulong)this->stage,pTVar1);
    (*this->resolver->_vptr_TIoMapResolver[8])(this->resolver,(ulong)this->stage,pTVar1);
    (*this->resolver->_vptr_TIoMapResolver[9])(this->resolver,(ulong)this->stage,pTVar1);
    return;
  }
  local_40._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  iVar2 = (*(((entKey->second).symbol)->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode
            [0x1e])();
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x58))
                             ((long *)CONCAT44(extraout_var,iVar2));
  if (*plVar3 == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    _M_replace(&local_40,0,local_40._M_string_length,"Invalid shader In/Out variable: ",0x20);
    iVar2 = (*(((entKey->second).symbol)->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode
              [0x32])();
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    _M_append(&local_40,*(char **)(CONCAT44(extraout_var_01,iVar2) + 8),
              *(size_type *)(CONCAT44(extraout_var_01,iVar2) + 0x10));
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    _M_replace(&local_40,0,local_40._M_string_length,"Invalid shader In/Out variable semantic: ",
               0x29);
    iVar2 = (*(((entKey->second).symbol)->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode
              [0x1e])();
    puVar4 = (undefined8 *)
             (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x58))
                       ((long *)CONCAT44(extraout_var_00,iVar2));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (&local_40,(char *)*puVar4);
  }
  TInfoSinkBase::message(&this->infoSink->info,EPrefixInternalError,local_40._M_dataplus._M_p);
  *this->error = true;
  return;
}

Assistant:

inline void operator()(std::pair<const TString, TVarEntryInfo>& entKey)
    {
        TVarEntryInfo& ent = entKey.second;
        ent.clearNewAssignments();
        const bool isValid = resolver.validateInOut(ent.stage, ent);
        if (isValid) {
            resolver.resolveInOutLocation(stage, ent);
            resolver.resolveInOutComponent(stage, ent);
            resolver.resolveInOutIndex(stage, ent);
        } else {
            TString errorMsg;
            if (ent.symbol->getType().getQualifier().semanticName != nullptr) {
                errorMsg = "Invalid shader In/Out variable semantic: ";
                errorMsg += ent.symbol->getType().getQualifier().semanticName;
            } else {
                errorMsg = "Invalid shader In/Out variable: ";
                errorMsg += ent.symbol->getName();
            }
            infoSink.info.message(EPrefixInternalError, errorMsg.c_str());
            error = true;
        }
    }